

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O2

void data_clear(CUPDLPdata *data)

{
  if (data == (CUPDLPdata *)0x0) {
    return;
  }
  switch(data->matrix_format) {
  case DENSE:
    dense_clear(data->dense_matrix);
    break;
  case CSR:
    csr_clear(data->csr_matrix);
    break;
  case CSR_CSC:
    csr_clear(data->csr_matrix);
  case CSC:
    csc_clear(data->csc_matrix);
  }
  free(data);
  return;
}

Assistant:

void data_clear(CUPDLPdata *data) {
  if (data) {
    switch (data->matrix_format) {
      case DENSE:
        dense_clear(data->dense_matrix);
        break;
      case CSR:
        csr_clear(data->csr_matrix);
        break;
      case CSC:
        csc_clear(data->csc_matrix);
        break;
      case CSR_CSC:
        csr_clear(data->csr_matrix);
        csc_clear(data->csc_matrix);
        break;
    }
    cupdlp_free(data);
  }
}